

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list_tests.cpp
# Opt level: O0

void __thiscall
omp_make_loaded_list_empty_test_Test::omp_make_loaded_list_empty_test_Test
          (omp_make_loaded_list_empty_test_Test *this)

{
  omp_make_loaded_list_empty_test_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__omp_make_loaded_list_empty_test_Test_0023cf80;
  return;
}

Assistant:

TEST(omp_make_loaded_list, empty_test) {
  auto mock = std::make_shared<TestMock>();

  EXPECT_CALL(*mock.get(), LoadDataList);

  EXPECT_CALL(*mock.get(), Count)
      .WillRepeatedly(DoAll(SetArgPointee<0>(0), Return(true)));

  auto list = omp::make_loaded_list(mock);

  ASSERT_TRUE(std::empty(list));
  ASSERT_TRUE(std::cbegin(list) == std::cend(list));
}